

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O1

void __thiscall proto2_unittest::TestEagerMaybeLazy::Clear(TestEagerMaybeLazy *this)

{
  TestAllTypes *pTVar1;
  TestEagerMaybeLazy_NestedMessage *this_00;
  anon_union_32_1_493b367e_for_TestEagerMaybeLazy_3 aVar2;
  Nonnull<const_char_*> failure_msg;
  int line;
  LogMessageFatal local_20;
  
  aVar2 = this->field_0;
  if (((undefined1  [32])aVar2 & (undefined1  [32])0x7) != (undefined1  [32])0x0) {
    if (((undefined1  [32])aVar2 & (undefined1  [32])0x1) != (undefined1  [32])0x0) {
      pTVar1 = (this->field_0)._impl_.message_foo_;
      if (pTVar1 == (TestAllTypes *)0x0) {
        failure_msg = "_impl_.message_foo_ != nullptr";
        line = 0x6767;
        goto LAB_00cc0c1f;
      }
      TestAllTypes::Clear(pTVar1);
    }
    if (((undefined1  [32])aVar2 & (undefined1  [32])0x2) != (undefined1  [32])0x0) {
      pTVar1 = (this->field_0)._impl_.message_bar_;
      if (pTVar1 == (TestAllTypes *)0x0) {
        failure_msg = "_impl_.message_bar_ != nullptr";
        line = 0x676b;
        goto LAB_00cc0c1f;
      }
      TestAllTypes::Clear(pTVar1);
    }
    if (((undefined1  [32])aVar2 & (undefined1  [32])0x4) != (undefined1  [32])0x0) {
      this_00 = (this->field_0)._impl_.message_baz_;
      if (this_00 == (TestEagerMaybeLazy_NestedMessage *)0x0) {
        failure_msg = "_impl_.message_baz_ != nullptr";
        line = 0x676f;
LAB_00cc0c1f:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_20,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/google/protobuf/unittest.pb.cc"
                   ,line,failure_msg);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
      }
      TestEagerMaybeLazy_NestedMessage::Clear(this_00);
    }
  }
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestEagerMaybeLazy::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.TestEagerMaybeLazy)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(_impl_.message_foo_ != nullptr);
      _impl_.message_foo_->Clear();
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(_impl_.message_bar_ != nullptr);
      _impl_.message_bar_->Clear();
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      ABSL_DCHECK(_impl_.message_baz_ != nullptr);
      _impl_.message_baz_->Clear();
    }
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}